

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_10,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in1;
  Type in0;
  Vec4 *local_f0;
  undefined8 local_e8;
  float local_e0 [6];
  Matrix<float,_3,_3> local_c8;
  float local_9c [6];
  float local_84 [3];
  Matrix<float,_4,_3> local_78;
  Matrix<float,_4,_3> local_40;
  
  pfVar2 = (float *)&local_78;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_78.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  pfVar2 = (float *)&local_c8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x24);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_c8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_c8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_c8.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_c8.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_c8.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    local_c8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_c8.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    local_c8.m_data.m_data[1].m_data[1] = 0.0;
    local_c8.m_data.m_data[1].m_data[2] = 0.0;
    local_c8.m_data.m_data[2].m_data[0] = 0.0;
    local_c8.m_data.m_data[2].m_data[1] = 0.0;
    local_c8.m_data.m_data[0].m_data[0] = 0.0;
    local_c8.m_data.m_data[0].m_data[1] = 0.0;
    local_c8.m_data.m_data[0].m_data[2] = 0.0;
    local_c8.m_data.m_data[1].m_data[0] = 0.0;
    local_c8.m_data.m_data[2].m_data[2] = 0.0;
    puVar4 = &DAT_00b4c354;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pfVar6 = pfVar2;
      do {
        *pfVar6 = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pfVar6 = pfVar6 + 3;
      } while (lVar5 != 3);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  tcu::operator*(&local_40,&local_78,&local_c8);
  local_84[0] = local_40.m_data.m_data[0].m_data[0];
  local_84[1] = local_40.m_data.m_data[0].m_data[1];
  local_84[2] = local_40.m_data.m_data[0].m_data[2];
  local_9c[3] = local_40.m_data.m_data[1].m_data[1];
  local_9c[4] = local_40.m_data.m_data[1].m_data[2];
  local_9c[5] = local_40.m_data.m_data[1].m_data[3];
  local_f0 = (Vec4 *)0x0;
  local_e8 = (ulong)local_e8._4_4_ << 0x20;
  lVar3 = 0;
  do {
    *(float *)((long)&local_f0 + lVar3 * 4) = local_9c[lVar3 + 6] + local_9c[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_9c[0] = local_40.m_data.m_data[2].m_data[2];
  local_9c[1] = local_40.m_data.m_data[2].m_data[3];
  local_9c[2] = local_40.m_data.m_data[2].m_data[0];
  local_e0[2] = 0.0;
  local_e0[3] = 0.0;
  local_e0[4] = 0.0;
  lVar3 = 0;
  do {
    local_e0[lVar3 + 2] = *(float *)((long)&local_f0 + lVar3 * 4) + local_9c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f0 = &evalCtx->color;
  local_e8 = 0x100000000;
  local_e0[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_f0 + lVar3 * 4)] = local_e0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}